

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

IsoHeaderData * IsoHeaderData::normal(void)

{
  uint32_t uVar1;
  time_t tVar2;
  IsoHeaderData *in_RDI;
  allocator<char> local_5e;
  allocator<char> local_5d;
  uint32_t local_5c;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"*tsMuxeR git-7f8667d",&local_5d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"*tsMuxeR ",&local_5e);
  local_5c = random32();
  int32uToHex_abi_cxx11_(&local_58,&local_5c);
  std::operator+(&in_RDI->impId,&local_38,&local_58);
  tVar2 = time((time_t *)0x0);
  in_RDI->fileTime = tVar2;
  uVar1 = random32();
  in_RDI->volumeId = uVar1;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

IsoHeaderData IsoHeaderData::normal()
{
    return IsoHeaderData{"*tsMuxeR " TSMUXER_VERSION, std::string("*tsMuxeR ") + int32uToHex(random32()), time(nullptr),
                         random32()};
}